

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  WhereLoop *pTemplate;
  WhereInfo *pWVar4;
  SrcList *pSVar5;
  Table *pTVar6;
  Index *pIVar7;
  ExprList *pEVar8;
  WhereTerm *pWVar9;
  UnpackedRecord *p;
  sqlite3 *db;
  bool bVar10;
  Bitmask BVar11;
  u8 uVar12;
  LogEst LVar13;
  short sVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  u32 uVar18;
  undefined6 extraout_var;
  ushort uVar19;
  Index *pIdx;
  KeyInfo *p_00;
  ulong uVar20;
  ExprList_item *pEVar21;
  ExprList_item *pEVar22;
  Expr *pA;
  ushort uVar23;
  WhereTerm *pWVar24;
  long lVar25;
  Mem *p_01;
  long lVar26;
  bool bVar27;
  i16 aiColumnPk;
  LogEst aiRowEstPk [2];
  Index sPk;
  i16 local_10a;
  ulong local_108;
  WhereClause *local_100;
  WhereInfo *local_f8;
  WhereTerm *local_f0;
  ExprList *local_e8;
  Bitmask local_e0;
  ExprList_item *local_d8;
  LogEst local_cc [2];
  Index local_c8;
  
  local_10a = -1;
  pTemplate = pBuilder->pNew;
  pWVar4 = pBuilder->pWInfo;
  local_100 = pBuilder->pWC;
  pSVar5 = pWVar4->pTabList;
  bVar2 = pTemplate->iTab;
  pTVar6 = pSVar5->a[bVar2].pTab;
  pIVar7 = pSVar5->a[bVar2].pIBIndex;
  pIdx = pIVar7;
  local_e0 = mPrereq;
  if (pIVar7 == (Index *)0x0) {
    if ((pTVar6->tabFlags & 0x20) == 0) {
      pIdx = &local_c8;
      memset(pIdx,0,0x98);
      local_c8.nKeyCol = 1;
      local_c8.nColumn = 1;
      local_c8.aiColumn = &local_10a;
      local_c8.aiRowLogEst = local_cc;
      local_c8.onError = '\x05';
      local_c8.pTable = pTVar6;
      local_c8.szIdxRow = pTVar6->szTabRow;
      local_c8._99_2_ = 3;
      local_cc[0] = pTVar6->nRowLogEst;
      local_cc[1] = 0;
      if ((pSVar5->a[bVar2].fg.field_0x1 & 1) == 0) {
        local_c8.pNext = pTVar6->pIndex;
      }
    }
    else {
      pIdx = pTVar6->pIndex;
    }
  }
  BVar11 = local_e0;
  sVar14 = pTVar6->nRowLogEst;
  iVar17 = 0;
  iVar16 = 0;
  iVar15 = 0;
  if (10 < (long)sVar14) {
    LVar13 = sqlite3LogEst((long)sVar14);
    iVar15 = (int)CONCAT62(extraout_var,LVar13) + -0x21;
  }
  local_f8 = pWVar4;
  if ((((((pBuilder->pOrSet == (WhereOrSet *)0x0) && ((pWVar4->wctrlFlags & 0x20) == 0)) &&
        ((pWVar4->pParse->db->flags & 0x8000) != 0)) &&
       ((iVar17 = iVar16, pIVar7 == (Index *)0x0 &&
        (bVar3 = pSVar5->a[bVar2].fg.field_0x1, (bVar3 & 1) == 0)))) && ((bVar3 & 0x28) == 0)) &&
     (((pTVar6->tabFlags & 0x20) == 0 && (0 < (long)local_100->nTerm)))) {
    local_f0 = local_100->a + local_100->nTerm;
    local_108 = CONCAT44(local_108._4_4_,iVar15 + sVar14 + -10);
    local_e8 = (ExprList *)CONCAT44(local_e8._4_4_,iVar15 + sVar14 + 0x1c);
    pWVar9 = local_100->a;
    do {
      pWVar24 = pWVar9 + 1;
      iVar17 = 0;
      if ((pWVar9->prereqRight & pTemplate->maskSelf) == 0) {
        iVar17 = 0;
        iVar16 = termCanDriveIndex(pWVar9,pSVar5->a + bVar2,0);
        if (iVar16 != 0) {
          (pTemplate->u).btree.nEq = 1;
          (pTemplate->u).btree.pIndex = (Index *)0x0;
          pTemplate->nLTerm = 1;
          pTemplate->nSkip = 0;
          *pTemplate->aLTerm = pWVar9;
          if ((pTVar6->pSelect != (Select *)0x0) ||
             (sVar14 = (short)local_e8, (pTVar6->tabFlags & 2) != 0)) {
            sVar14 = (short)local_108;
          }
          LVar13 = 0;
          if (0 < sVar14) {
            LVar13 = sVar14;
          }
          pTemplate->rSetup = LVar13;
          pTemplate->nOut = 0x2b;
          LVar13 = sqlite3LogEstAdd((LogEst)iVar15,0x2b);
          pTemplate->rRun = LVar13;
          pTemplate->wsFlags = 0x4000;
          pTemplate->prereq = pWVar9->prereqRight | BVar11;
          iVar17 = whereLoopInsert(pBuilder,pTemplate);
        }
      }
    } while ((iVar17 == 0) && (pWVar9 = pWVar24, pWVar24 < local_f0));
  }
  if ((iVar17 != 0) || (pIdx == (Index *)0x0)) {
    return iVar17;
  }
  local_f0 = (WhereTerm *)CONCAT44(local_f0._4_4_,1);
  do {
    if (((pIdx->pPartIdxWhere == (Expr *)0x0) ||
        (iVar17 = whereUsablePartialIndex(pSVar5->a[bVar2].iCursor,local_100,pIdx->pPartIdxWhere),
        iVar17 != 0)) && ((pIdx->field_0x64 & 1) == 0)) {
      uVar23 = *pIdx->aiRowLogEst;
      (pTemplate->u).vtab.idxNum = 0;
      (pTemplate->u).btree.nTop = 0;
      pTemplate->nLTerm = 0;
      pTemplate->nSkip = 0;
      pTemplate->iSortIdx = '\0';
      pTemplate->rSetup = 0;
      pTemplate->prereq = local_e0;
      pTemplate->nOut = uVar23;
      (pTemplate->u).btree.pIndex = pIdx;
      bVar10 = true;
      if ((((pIdx->field_0x63 & 4) == 0) &&
          (pEVar8 = pBuilder->pWInfo->pOrderBy, pEVar8 != (ExprList *)0x0)) &&
         (iVar17 = pEVar8->nExpr, 0 < iVar17)) {
        local_108 = CONCAT44(local_108._4_4_,pSVar5->a[bVar2].iCursor);
        pEVar21 = pEVar8->a;
        lVar25 = 0;
        local_e8 = pEVar8;
        local_d8 = pEVar21;
        do {
          pA = pEVar21[lVar25].pExpr;
          while (pA != (Expr *)0x0) {
            if ((pA->flags >> 0xc & 1) == 0) goto LAB_00185a1a;
            if ((pA->flags >> 0x12 & 1) == 0) {
              pEVar22 = (ExprList_item *)&pA->pLeft;
            }
            else {
              pEVar22 = ((pA->x).pList)->a;
            }
            pA = pEVar22->pExpr;
          }
          pA = (Expr *)0x0;
LAB_00185a1a:
          if ((pA->op == 0xa2) && (pA->iTable == (int)local_108)) {
            if (pA->iColumn < 0) {
              bVar10 = false;
              break;
            }
            if ((ulong)pIdx->nKeyCol != 0) {
              uVar20 = 0;
              do {
                if (pA->iColumn == pIdx->aiColumn[uVar20]) {
                  bVar10 = false;
                  goto LAB_00185b08;
                }
                uVar20 = uVar20 + 1;
              } while (pIdx->nKeyCol != uVar20);
            }
          }
          else if ((pIdx->aColExpr != (ExprList *)0x0) && (uVar19 = pIdx->nKeyCol, uVar19 != 0)) {
            pEVar21 = pIdx->aColExpr->a;
            uVar20 = 0;
            do {
              if (pIdx->aiColumn[uVar20] == -2) {
                iVar17 = sqlite3ExprCompareSkip(pA,pEVar21->pExpr,(int)local_108);
                if (iVar17 == 0) {
                  bVar10 = false;
                  goto LAB_00185b08;
                }
                uVar19 = pIdx->nKeyCol;
              }
              uVar20 = uVar20 + 1;
              pEVar21 = pEVar21 + 1;
            } while (uVar20 < uVar19);
            iVar17 = local_e8->nExpr;
            pEVar21 = local_d8;
          }
          bVar10 = true;
          lVar25 = lVar25 + 1;
        } while (lVar25 < iVar17);
      }
LAB_00185b08:
      if ((~*(ushort *)&pIdx->field_0x63 & 3) == 0) {
        uVar12 = (u8)local_f0;
        if (bVar10) {
          uVar12 = '\0';
        }
        pTemplate->wsFlags = 0x100;
        pTemplate->iSortIdx = uVar12;
        pTemplate->rRun = uVar23 + 0x10;
LAB_00185c6b:
        whereLoopOutputAdjust(local_100,pTemplate,uVar23);
        iVar17 = whereLoopInsert(pBuilder,pTemplate);
        pTemplate->nOut = uVar23;
        if (iVar17 != 0) {
          return iVar17;
        }
      }
      else {
        if ((*(ushort *)&pIdx->field_0x63 & 0x20) == 0) {
          bVar27 = (pSVar5->a[bVar2].colUsed & pIdx->colNotIdxed) == 0;
          uVar18 = (bVar27 | 8) << 6;
        }
        else {
          bVar27 = true;
          uVar18 = 0x240;
        }
        pTemplate->wsFlags = uVar18;
        uVar12 = (u8)local_f0;
        if (!bVar10) {
LAB_00185b89:
          pTemplate->iSortIdx = uVar12;
          LVar13 = uVar23 + (short)((pIdx->szIdxRow * 0xf) / (int)pTVar6->szTabRow) + 1;
          pTemplate->rRun = LVar13;
          if (!bVar27) {
            sVar14 = uVar23 + 0x10;
            if (0 < (local_f8->sWC).nTerm) {
              iVar17 = pSVar5->a[bVar2].iCursor;
              lVar25 = 0x14;
              lVar26 = 0;
              local_108 = (ulong)uVar23;
              do {
                pWVar9 = (local_f8->sWC).a;
                iVar15 = sqlite3ExprCoveredByIndex
                                   (*(Expr **)((long)pWVar9 + lVar25 + -0x14),iVar17,pIdx);
                if (iVar15 == 0) break;
                uVar23 = *(ushort *)((long)pWVar9 + lVar25 + -4);
                if (0 < (short)uVar23) {
                  uVar23 = -(ushort)((*(byte *)((long)&pWVar9->pExpr + lVar25) & 0x82) == 0) |
                           0xffec;
                }
                sVar14 = uVar23 + sVar14;
                lVar26 = lVar26 + 1;
                lVar25 = lVar25 + 0x40;
              } while (lVar26 < (local_f8->sWC).nTerm);
              LVar13 = pTemplate->rRun;
              uVar23 = (ushort)local_108;
            }
            LVar13 = sqlite3LogEstAdd(LVar13,sVar14);
            pTemplate->rRun = LVar13;
          }
          goto LAB_00185c6b;
        }
        uVar12 = '\0';
        if ((((pTVar6->tabFlags & 0x20) != 0) || (pIdx->pPartIdxWhere != (Expr *)0x0)) ||
           (((bVar27 &&
             ((((pIdx->field_0x63 & 4) == 0 && (pIdx->szIdxRow < pTVar6->szTabRow)) &&
              ((local_f8->wctrlFlags & 4) == 0)))) &&
            ((sqlite3Config.bUseCis != 0 &&
             (uVar12 = '\0', (local_f8->pParse->db->dbOptFlags & 0x20) == 0)))))) goto LAB_00185b89;
      }
      pBuilder->bldFlags = 0;
      iVar17 = whereLoopAddBtreeIndex(pBuilder,pSVar5->a + bVar2,pIdx,0);
      if (pBuilder->bldFlags == 1) {
        pbVar1 = (byte *)((long)&pTVar6->tabFlags + 1);
        *pbVar1 = *pbVar1 | 1;
      }
      p = pBuilder->pRec;
      if (p != (UnpackedRecord *)0x0) {
        p_00 = p->pKeyInfo;
        p_01 = p->aMem;
        uVar20 = (ulong)p_00->nAllField;
        db = p_01->db;
        if (uVar20 == 0) {
LAB_00185d06:
          p_00->nRef = p_00->nRef - 1;
          if (p_00->nRef == 0) {
            sqlite3DbFreeNN(p_00->db,p_00);
          }
        }
        else {
          do {
            if (((p_01->flags & 0x2400) != 0) || (p_01->szMalloc != 0)) {
              vdbeMemClear(p_01);
            }
            p_01 = p_01 + 1;
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
          p_00 = p->pKeyInfo;
          if (p_00 != (KeyInfo *)0x0) goto LAB_00185d06;
        }
        sqlite3DbFreeNN(db,p);
      }
      pBuilder->nRecValid = 0;
      pBuilder->pRec = (UnpackedRecord *)0x0;
    }
    else {
      iVar17 = 0;
    }
    if (pSVar5->a[bVar2].pIBIndex != (Index *)0x0) {
      return iVar17;
    }
    if (iVar17 != 0) {
      return iVar17;
    }
    pIdx = pIdx->pNext;
    local_f0 = (WhereTerm *)CONCAT44(local_f0._4_4_,(int)local_f0 + 1);
    if (pIdx == (Index *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequesites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  struct SrcList_item *pSrc;  /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  LogEst rLogSize;            /* Logarithm of the number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */
  
  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pTab) );

  if( pSrc->pIBIndex ){
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = pTab->szTabRow;
    sPk.idxType = SQLITE_IDXTYPE_IPK;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;
  rLogSize = estLog(rSize);

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && pSrc->pIBIndex==0      /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && HasRowid(pTab)         /* Not WITHOUT ROWID table. (FIXME: Why not?) */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
  ){
    /* Generate auto-index WhereLoops */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 0.5 (LogEst=-10) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize;
        if( pTab->pSelect==0 && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 28;
        }else{
          pNew->rSetup -= 10;
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices. If there was an INDEXED BY clause, then only 
  ** consider index pProbe.  */
  for(; rc==SQLITE_OK && pProbe; 
      pProbe=(pSrc->pIBIndex ? 0 : pProbe->pNext), iSortIdx++
  ){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pWC, pProbe->pPartIdxWhere) ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    if( pProbe->bNoQuery ) continue;
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);
    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->idxType==SQLITE_IDXTYPE_IPK ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is (N*3.0). */
      pNew->rRun = rSize + 16;
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        m = 0;
      }else{
        m = pSrc->colUsed & pProbe->colNotIdxed;
        pNew->wsFlags = (m==0) ? (WHERE_IDX_ONLY|WHERE_INDEXED) : WHERE_INDEXED;
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }
          
          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        rc = whereLoopInsert(pBuilder, pNew);
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags==SQLITE_BLDF_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_StatsUsed;
    }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif
  }
  return rc;
}